

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void RigidBodyDynamics::ForwardDynamicsApplyConstraintForces
               (Model *model,VectorNd *Tau,ConstraintSet *CS,VectorNd *QDDot)

{
  JointType JVar1;
  uint uVar2;
  pointer pSVar3;
  pointer pJVar4;
  double *pdVar5;
  pointer ppCVar6;
  CustomJoint *pCVar7;
  pointer pSVar8;
  double dVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  LhsNested pMVar15;
  uint uVar16;
  ulong uVar17;
  pointer pSVar18;
  SpatialTransform *pSVar19;
  double dVar20;
  LhsNested pMVar21;
  SpatialVector *mv;
  byte bVar22;
  ResScalar RVar23;
  VectorNd tau_temp;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
  *local_3f0;
  SpatialMatrix *local_3e8;
  NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *local_3e0;
  long local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [16];
  LhsNested local_3b8;
  scalar_constant_op<double> local_3b0;
  double local_3a8;
  CustomJoint *local_3a0;
  CustomJoint *local_398;
  CustomJoint *local_390;
  double local_388;
  double local_370;
  SpatialVector pa;
  SpatialMatrix Ia;
  Vector3d qdd_temp;
  
  bVar22 = 0;
  uVar17 = 1;
  while( true ) {
    uVar11 = ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->mBodies).
                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x70;
    if (uVar11 <= uVar17) break;
    Math::SpatialRigidBodyInertia::toMatrix
              (&Ia,(model->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
    memcpy((model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
           super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
           super__Vector_impl_data._M_start + uVar17,&Ia,0x120);
    mv = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
         super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
         super__Vector_impl_data._M_start + uVar17;
    Math::SpatialRigidBodyInertia::operator*
              ((SpatialVector *)local_3c8,
               (model->I).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar17,mv);
    Math::crossf(mv,(SpatialVector *)local_3c8);
    pSVar3 = (model->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar5 = (double *)
             ((long)&pSVar3[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
    *pdVar5 = Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4]
    ;
    pdVar5[1] = Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [5];
    pdVar5 = (double *)
             ((long)&pSVar3[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
    *pdVar5 = Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
    ;
    pdVar5[1] = Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [3];
    *(double *)
     &pSVar3[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar3[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
         Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
    bVar10 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator!=
                       ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)
                        (*(long *)(CS + 0x550) + uVar17 * 0x30),
                        (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                         *)&Ia);
    if (bVar10) {
      Math::SpatialTransform::toMatrixAdjoint
                (&Ia,(model->X_base).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17);
      local_3c8._8_8_ = *(long *)(CS + 0x550) + uVar17 * 0x30;
      local_3c8._0_8_ =
           (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            *)&Ia;
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-=
                ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)
                 ((model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar17),
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)local_3c8);
    }
    uVar17 = (ulong)((int)uVar17 + 1);
  }
LAB_00203438:
  while( true ) {
    uVar16 = (int)uVar11 - 1;
    uVar11 = (ulong)uVar16;
    if (uVar16 == 0) break;
    uVar17 = (ulong)uVar16;
    pJVar4 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = pJVar4[uVar17].q_index;
    JVar1 = pJVar4[uVar17].mJointType;
    if (pJVar4[uVar17].mDoFCount == 1) {
      if (JVar1 == JointTypeCustom) goto LAB_0020384d;
      dVar14 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data[uVar16];
      RVar23 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     ((model->S).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17),
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     ((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17));
      (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar17] = dVar14 - RVar23;
      uVar12 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17];
      if (uVar12 != 0) {
        local_3c8._0_8_ =
             (model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
             super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar17;
        local_3c8._8_8_ =
             (model->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar17;
        local_3a8 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar17];
        local_3b8.m_matrix = (non_const_type)local_3c8._8_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                    *)local_3c8);
        local_3c8._8_8_ =
             (model->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar17;
        local_3b0.m_other =
             (double)((model->c).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17);
        local_398 = (CustomJoint *)
                    ((model->U).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17);
        local_388 = (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar17];
        local_370 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar17];
        local_3b8.m_matrix = (non_const_type)&Ia;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&pa,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                    *)local_3c8);
        Math::SpatialTransform::toMatrixTranspose
                  ((SpatialMatrix *)local_3c8,
                   (model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
        Math::SpatialTransform::toMatrix
                  ((SpatialMatrix *)&qdd_temp,
                   (model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
        local_3e8 = &Ia;
        tau_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)
             ((model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
              super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar12);
        local_3f0 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                     *)local_3c8;
        local_3e0 = (NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&qdd_temp;
        Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase> *)&tau_temp,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                    *)&local_3f0);
        Math::SpatialTransform::applyTranspose
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17,&pa);
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] =
             (double)((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar12);
        Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&qdd_temp,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_3c8);
      }
    }
    else {
      if (pJVar4[uVar17].mDoFCount != 3) goto LAB_00203844;
      if (JVar1 == JointTypeCustom) goto LAB_0020384d;
      uVar12 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17];
      pdVar5 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      local_3c8._0_8_ = pdVar5[uVar16];
      local_3c8._8_8_ = pdVar5[uVar16 + 1];
      local_3b8.m_matrix = (non_const_type)pdVar5[uVar16 + 2];
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
           (double)((model->multdof3_S).
                    super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar17);
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
           (double)((model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar17);
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           (double)local_3c8;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>>
                (&(model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar17].super_Vector3d,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&Ia);
      if (uVar12 != 0) {
        local_3c8._0_8_ =
             (model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
             super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar17;
        local_3c8._8_8_ =
             (model->multdof3_U).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar17;
        local_3b8.m_matrix =
             (non_const_type)
             ((model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar17);
        local_3d8 = uVar17 * 0x90;
        local_3b0.m_other = (double)local_3c8._8_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                    *)local_3c8);
        local_3c8._8_8_ =
             (model->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar17;
        local_3b0.m_other =
             (double)((model->c).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17);
        local_3a0 = (CustomJoint *)
                    ((long)&(((model->multdof3_U).
                              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              .
                              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                    + local_3d8);
        local_398 = (CustomJoint *)
                    ((model->multdof3_Dinv).
                     super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar17);
        local_390 = (CustomJoint *)
                    ((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar17);
        local_3b8.m_matrix = (non_const_type)&Ia;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&pa,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)local_3c8);
        Math::SpatialTransform::toMatrixTranspose
                  ((SpatialMatrix *)local_3c8,
                   (model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
        Math::SpatialTransform::toMatrix
                  ((SpatialMatrix *)&qdd_temp,
                   (model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
        local_3e8 = &Ia;
        tau_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)
             ((model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
              super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar12);
        local_3f0 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                     *)local_3c8;
        local_3e0 = (NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&qdd_temp;
        Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase> *)&tau_temp,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                    *)&local_3f0);
        Math::SpatialTransform::applyTranspose
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17,&pa);
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] =
             (double)((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar12);
        Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&qdd_temp,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_3c8);
      }
    }
  }
  dVar14 = (model->gravity).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  pSVar3 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar20 = (model->gravity).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar9 = (model->gravity).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(undefined8 *)
   &(pSVar3->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar3->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(double *)
   ((long)&(pSVar3->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar3->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = -dVar20;
  *(double *)
   ((long)&(pSVar3->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = -dVar9;
  *(double *)
   ((long)&(pSVar3->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = -dVar14;
  uVar17 = 1;
  do {
    if ((ulong)(((long)(model->mBodies).
                       super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar17) {
      return;
    }
    uVar16 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar17].q_index;
    uVar2 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17];
    pSVar8 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar18 = pSVar8 + uVar17;
    pSVar19 = (SpatialTransform *)&Ia;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pSVar19->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&(pSVar18->E).super_Matrix3d;
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar22 * -2 + 1) * 8);
      pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar22 * -0x10 + 8);
    }
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
         *(double *)((long)&pSVar8[uVar17].r.super_Vector3d + 0x10);
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
         *(double *)
          &pSVar8[uVar17].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
         *(double *)
          ((long)&pSVar8[uVar17].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    Math::SpatialTransform::apply
              ((SpatialTransform *)&Ia,
               (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar2);
    qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] =
         (double)((model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar17);
    qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = (double)local_3c8;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
              (&(model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>
               ,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                 *)&qdd_temp);
    pJVar4 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    JVar1 = pJVar4[uVar17].mJointType;
    if (pJVar4[uVar17].mDoFCount == 1) {
      if (JVar1 == JointTypeCustom) goto LAB_00203d1e;
      dVar14 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar17];
      dVar20 = (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar17];
      RVar23 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     ((model->U).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17),
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     ((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17));
      local_3b0.m_other = (dVar20 - RVar23) * (1.0 / dVar14);
      (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [uVar16] = local_3b0.m_other;
      local_3c8._0_8_ =
           (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start + uVar17;
      local_3c8._8_8_ =
           (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start + uVar17;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                ((Matrix<double,_6,_1,_0,_6,_1> *)local_3c8._0_8_,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                  *)local_3c8);
    }
    else if (pJVar4[uVar17].mDoFCount == 3) {
      if (JVar1 == JointTypeCustom) {
LAB_00203d1e:
        uVar2 = pJVar4[uVar17].custom_joint_index;
        pMVar21 = (LhsNested)
                  (ulong)*(uint *)((model->mCustomJoints).
                                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar2] + 8);
        local_3b8.m_matrix = (non_const_type)0x0;
        local_3c8._0_8_ = pMVar21;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&qdd_temp,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_3c8);
        pCVar7 = (model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2];
        local_3c8._0_8_ = pCVar7 + 0xa0;
        local_3c8._8_8_ = pCVar7 + 0xb8;
        local_3b8.m_matrix = (non_const_type)(pCVar7 + 0x88);
        local_3b0.m_other =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&qdd_temp,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>
                    *)local_3c8);
        pdVar5 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        for (pMVar15 = (LhsNested)0x0; pMVar21 != pMVar15;
            pMVar15 = (LhsNested)
                      ((long)(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>)
                             .m_storage.m_data.array + 1)) {
          pdVar5[uVar16 + (int)pMVar15] =
               *(double *)
                ((long)qdd_temp.super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0] + (long)pMVar15 * 8);
        }
        local_3c8._0_8_ =
             (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar17;
        local_3c8._8_8_ =
             (model->mCustomJoints).
             super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2] + 0x70;
        local_3b8.m_matrix = (non_const_type)&qdd_temp;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)local_3c8._0_8_,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)local_3c8);
        free((void *)qdd_temp.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0]);
      }
      else {
        local_3c8._0_8_ =
             (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar17;
        local_3c8._8_8_ =
             (model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
             super__Vector_impl_data._M_start + uVar17;
        local_3b8.m_matrix =
             (non_const_type)
             ((model->multdof3_U).
              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar17);
        local_3b0.m_other =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17);
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&qdd_temp,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)local_3c8);
        pdVar5 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar5[uVar16] =
             qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        pdVar5[uVar16 + 1] =
             qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
        pdVar5[uVar16 + 2] =
             qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
        local_3c8._0_8_ =
             (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar17;
        local_3c8._8_8_ =
             (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar17;
        local_3b8.m_matrix = (non_const_type)&qdd_temp;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)local_3c8._0_8_,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)local_3c8);
      }
    }
    else if (JVar1 == JointTypeCustom) goto LAB_00203d1e;
    uVar17 = (ulong)((int)uVar17 + 1);
  } while( true );
LAB_00203844:
  if (JVar1 == JointTypeCustom) {
LAB_0020384d:
    uVar2 = pJVar4[uVar17].custom_joint_index;
    dVar20 = (double)(ulong)*(uint *)((model->mCustomJoints).
                                      super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar2] + 8);
    uVar12 = (ulong)(model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar17];
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = dVar20;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&tau_temp,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&Ia);
    pdVar5 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    for (dVar14 = 0.0; dVar20 != dVar14; dVar14 = (double)((long)dVar14 + 1)) {
      tau_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [(long)dVar14] = pdVar5[uVar16 + SUB84(dVar14,0)];
    }
    ppCVar6 = (model->mCustomJoints).
              super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)(ppCVar6[uVar2] + 0x70);
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         (double)((model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar17);
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&tau_temp;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)(ppCVar6[uVar2] + 0xb8),
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&Ia);
    if (uVar12 != 0) {
      local_3c8._0_8_ =
           (model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
           super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
           super__Vector_impl_data._M_start + uVar17;
      pCVar7 = (model->mCustomJoints).
               super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar2];
      local_3c8._8_8_ = pCVar7 + 0x88;
      local_3b8.m_matrix = (non_const_type)(pCVar7 + 0xa0);
      local_3b0.m_other = (double)local_3c8._8_8_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
                ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                  *)local_3c8);
      local_3c8._8_8_ =
           (model->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start + uVar17;
      local_3b0.m_other =
           (double)((model->c).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar17);
      local_390 = (model->mCustomJoints).
                  super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar2];
      local_3a0 = local_390 + 0x88;
      local_398 = local_390 + 0xa0;
      local_390 = local_390 + 0xb8;
      local_3b8.m_matrix = (non_const_type)&Ia;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&pa,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                  *)local_3c8);
      Math::SpatialTransform::toMatrixTranspose
                ((SpatialMatrix *)local_3c8,
                 (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17);
      Math::SpatialTransform::toMatrix
                ((SpatialMatrix *)&qdd_temp,
                 (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17);
      local_3e8 = &Ia;
      local_3d0 = (model->IA).
                  super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                  super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar12;
      local_3f0 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                   *)local_3c8;
      local_3e0 = (NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&qdd_temp;
      Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase> *)&local_3d0,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                  *)&local_3f0);
      Math::SpatialTransform::applyTranspose
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,&pa);
      qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
      .m_data.array[0] =
           (double)((model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar12);
      Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&qdd_temp,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_3c8);
    }
    free(tau_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  goto LAB_00203438;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsApplyConstraintForces (
  Model &model,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot
)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;
  assert (QDDot.size() == model.dof_count);

  unsigned int i = 0;

  for (i = 1; i < model.mBodies.size(); i++) {
    model.IA[i] = model.I[i].toMatrix();;
    model.pA[i] = crossf(model.v[i],model.I[i] * model.v[i]);

#ifdef RBDL_USE_CASADI_MATH
    {
#else
    if (CS.f_ext_constraints[i] != SpatialVector::Zero()) {
#endif
      LOG << "External force (" << i << ") = "
          << model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i]
          << std::endl;
      model.pA[i] -= model.X_base[i].toMatrixAdjoint()*CS.f_ext_constraints[i];
    }
  }

  // ClearLogOutput();

  LOG << "--- first loop ---" << std::endl;

  for (i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int q_index = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      unsigned int lambda = model.lambda[i];
      model.multdof3_u[i] = Vector3d (Tau[q_index],
                                      Tau[q_index + 1],
                                      Tau[q_index + 2])
                            - model.multdof3_S[i].transpose() * model.pA[i];

      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i] - (model.multdof3_U[i]
                                          * model.multdof3_Dinv[i]
                                          * model.multdof3_U[i].transpose());

        SpatialVector pa = model.pA[i] + Ia * model.c[i]
                           + model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_u[i];

#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose()
            << std::endl;
      }
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {
      model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i]
                           - model.U[i] * (model.U[i] / model.d[i]).transpose();
        SpatialVector pa =  model.pA[i] + Ia * model.c[i]
                            + model.U[i] * model.u[i] / model.d[i];
#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = "
            << model.pA[lambda].transpose() << std::endl;
      }
    } else if(model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      unsigned int lambda = model.lambda[i];
      VectorNd tau_temp = VectorNd::Zero(dofI);

      for(int z=0; z<dofI; ++z) {
        tau_temp[z] = Tau[q_index+z];
      }

      model.mCustomJoints[kI]->u = tau_temp
                                   - (model.mCustomJoints[kI]->S.transpose()
                                      * model.pA[i]);

      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i]
                           - (   model.mCustomJoints[kI]->U
                                 * model.mCustomJoints[kI]->Dinv
                                 * model.mCustomJoints[kI]->U.transpose());

        SpatialVector pa = model.pA[i] + Ia * model.c[i]
                           + ( model.mCustomJoints[kI]->U
                               * model.mCustomJoints[kI]->Dinv
                               * model.mCustomJoints[kI]->u );

#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
                                      * Ia * model.X_lambda[i].toMatrix();

        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
                                      * Ia * model.X_lambda[i].toMatrix();

        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose()
            << std::endl;
      }
    }
  }

  model.a[0] = SpatialVector (0., 0., 0.,
                              -model.gravity[0],
                              -model.gravity[1],
                              -model.gravity[2]);

  for (i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];
    SpatialTransform X_lambda = model.X_lambda[i];

    model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
    LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i] *
                          (model.multdof3_u[i]
                           - model.multdof3_U[i].transpose() * model.a[i]);

      QDDot[q_index] = qdd_temp[0];
      QDDot[q_index + 1] = qdd_temp[1];
      QDDot[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {
      QDDot[q_index] = (1./model.d[i]) * (
                         model.u[i] - model.U[i].dot(model.a[i]));
      model.a[i] = model.a[i] + model.S[i] * QDDot[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->u
                    - model.mCustomJoints[kI]->U.transpose()
                    * model.a[i]);

      for(int z=0; z<dofI; ++z) {
        QDDot[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + (model.mCustomJoints[kI]->S * qdd_temp);
    }
  }

  LOG << "QDDot = " << QDDot.transpose() << std::endl;
}

//==============================================================================
/** @brief Computes the effect of external forces on the generalized
            accelerations.

    This function is essentially similar to ForwardDynamics() except that it
    tries to only perform computations of variables that change due to
    external forces defined in f_t.
 */
RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
  Model &model,
  ConstraintSet &CS,
  VectorNd &QDDot_t,
  const unsigned int body_id,
  const std::vector<SpatialVector> &f_t
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.d_pA.size() == model.mBodies.size());
  assert (CS.d_a.size() == model.mBodies.size());
  assert (CS.d_u.size() == model.mBodies.size());

  // TODO reset all values (debug)
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    CS.d_pA[i].setZero();
    CS.d_a[i].setZero();
    CS.d_u[i] = 0.;
    CS.d_multdof3_u[i].setZero();
  }
  for(unsigned int i=0; i<model.mCustomJoints.size(); i++) {
    model.mCustomJoints[i]->d_u.setZero();
  }

  for (unsigned int i = body_id; i > 0; i--) {
    if (i == body_id) {
      CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
    }

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =   CS.d_pA[lambda]
                            + model.X_lambda[i].applyTranspose (
                              CS.d_pA[i] + (model.multdof3_U[i]
                                            * model.multdof3_Dinv[i]
                                            * CS.d_multdof3_u[i]));
      }
    } else if(model.mJoints[i].mDoFCount == 1
              && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        CS.d_pA[lambda] = CS.d_pA[lambda]
                          + model.X_lambda[i].applyTranspose (
                            CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      //CS.
      model.mCustomJoints[kI]->d_u =
        - model.mCustomJoints[kI]->S.transpose() * (CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =
          CS.d_pA[lambda]
          + model.X_lambda[i].applyTranspose (
            CS.d_pA[i] + (   model.mCustomJoints[kI]->U
                             * model.mCustomJoints[kI]->Dinv
                             * model.mCustomJoints[kI]->d_u)
          );
      }
    }
  }

  for (unsigned int i = 0; i < f_t.size(); i++) {
    LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
  }

  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
  }
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
  }

  QDDot_t[0] = 0.;
  CS.d_a[0] = model.a[0];

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i]
                          * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);

      QDDot_t[q_index] = qdd_temp[0];
      QDDot_t[q_index + 1] = qdd_temp[1];
      QDDot_t[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
      CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {

      QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
      CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->d_u
                    - model.mCustomJoints[kI]->U.transpose() * Xa);

      for(int z=0; z<dofI; ++z) {
        QDDot_t[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + model.mCustomJoints[kI]->S * qdd_temp;
      CS.d_a[i] = Xa + model.mCustomJoints[kI]->S * qdd_temp;
    }

    LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
    LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
  }
}

inline void set_zero (std::vector<SpatialVector> &spatial_values)
{
  for (unsigned int i = 0; i < spatial_values.size(); i++) {
    spatial_values[i].setZero();
  }
}

//==============================================================================
RBDL_DLLAPI
void ForwardDynamicsContactsKokkevis (
  Model &model,
  const VectorNd &Q,
  const VectorNd &QDot,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.f_ext_constraints.size() == model.mBodies.size());
  assert (CS.QDDot_0.size() == model.dof_count);
  assert (CS.QDDot_t.size() == model.dof_count);
  assert (CS.f_t.size() == CS.size());
  assert (CS.point_accel_0.size() == CS.size());
  assert (CS.K.rows() == CS.size());
  assert (CS.K.cols() == CS.size());
  assert (CS.force.size() == CS.size());
  assert (CS.a.size() == CS.size());

  if(CS.constraints.size() != CS.contactConstraints.size()) {
    std::stringstream errormsg;
    errormsg << "Incompatible constraint types: all constraints"
             << " must be ContactConstraints for the Kokkevis method"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  Vector3d point_accel_t;

  unsigned int ci = 0; //constraint index:
  // the row index in the constraint Jacobian.

  // The default acceleration only needs to be computed once
  {
    SUPPRESS_LOGGING;
    ForwardDynamics(model, Q, QDot, Tau, CS.QDDot_0);
  }

  LOG << "=== Initial Loop Start ===" << std::endl;
  // we have to compute the standard accelerations first as we use them to
  // compute the effects of each test force
  unsigned int bi = 0;
  for(bi =0; bi < CS.contactConstraints.size(); ++bi) {
    {
      SUPPRESS_LOGGING;
      UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_0);
    }
    {
      LOG << "body_id = "
          << CS.contactConstraints[bi]->getBodyIds()[0]
          << std::endl;
      LOG << "point = "
          << CS.contactConstraints[bi]->getBodyFrames()[0].r
          << std::endl;
      LOG << "QDDot_0 = " << CS.QDDot_0.transpose() << std::endl;
    }
    {
      SUPPRESS_LOGGING;
      CS.contactConstraints[bi]->calcPointAccelerations(
        model,Q,QDot,CS.QDDot_0,CS.point_accel_0,false);
      CS.contactConstraints[bi]->calcPointAccelerationError(
        CS.point_accel_0,CS.a);
    }
  }

  // K: ContactConstraints
  unsigned int cj=0;
  unsigned int movable_body_id = 0;
  Vector3d point_global;

  for (bi = 0; bi < CS.contactConstraints.size(); bi++) {

    LOG << "=== Testforce Loop Start ===" << std::endl;

    ci = CS.contactConstraints[bi]->getConstraintIndex();

    movable_body_id = GetMovableBodyId(model,
                                       CS.contactConstraints[bi]->getBodyIds()[0]);

    // assemble the test force
    LOG << "point_global = " << point_global.transpose() << std::endl;

    CS.contactConstraints[bi]->calcPointForceJacobian(
      model,Q,CS.cache,CS.f_t,false);

    for(unsigned int j = 0; j<CS.contactConstraints[bi]
        ->getConstraintNormalVectors().size(); ++j) {

      CS.f_ext_constraints[movable_body_id] = CS.f_t[ci+j];

      LOG << "f_t[" << movable_body_id << "] = " << CS.f_t[ci+j].transpose()
          << std::endl;
      {
        ForwardDynamicsAccelerationDeltas(model, CS, CS.QDDot_t
                                          , movable_body_id, CS.f_ext_constraints);

        LOG << "QDDot_0 = " << CS.QDDot_0.transpose() << std::endl;
        LOG << "QDDot_t = " << (CS.QDDot_t + CS.QDDot_0).transpose()
            << std::endl;
        LOG << "QDDot_t - QDDot_0 = " << (CS.QDDot_t).transpose() << std::endl;
      }

      CS.f_ext_constraints[movable_body_id].setZero();

      CS.QDDot_t += CS.QDDot_0;
      // compute the resulting acceleration
      {
        SUPPRESS_LOGGING;
        UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_t);
      }

      for(unsigned int dj = 0;
          dj < CS.contactConstraints.size(); dj++) {

        cj = CS.contactConstraints[dj]->getConstraintIndex();
        {
          SUPPRESS_LOGGING;
          CS.contactConstraints[dj]->calcPointAccelerations(
            model,Q,QDot,CS.QDDot_t,point_accel_t,false);
        }

        LOG << "point_accel_0  = " << CS.point_accel_0[ci+j].transpose()
            << std::endl;
        LOG << "point_accel_t = " << point_accel_t.transpose() << std::endl;
        for(unsigned int k=0;
            k < CS.contactConstraints[dj]
            ->getConstraintNormalVectors().size(); ++k) {

          CS.K(ci+j,cj+k) = CS.contactConstraints[dj]
                            ->getConstraintNormalVectors()[k].dot(
                              point_accel_t - CS.point_accel_0[cj+k]);
        }
      }
    }
  }




  LOG << "K = " << std::endl << CS.K << std::endl;
  LOG << "a = " << std::endl << CS.a << std::endl;

#ifdef RBDL_USE_CASADI_MATH
    auto linsol = casadi::Linsol("linear_solver", "symbolicqr", CS.K.sparsity());
    CS.force = linsol.solve(CS.K, CS.a);
#else
  switch (CS.linear_solver) {
  case (LinearSolverPartialPivLU) :
    CS.force = CS.K.partialPivLu().solve(CS.a);
    break;
  case (LinearSolverColPivHouseholderQR) :
    CS.force = CS.K.colPivHouseholderQr().solve(CS.a);
    break;
  case (LinearSolverHouseholderQR) :
    CS.force = CS.K.householderQr().solve(CS.a);
    break;
  default:
    LOG << "Error: Invalid linear solver: " << CS.linear_solver << std::endl;
    assert (0);
    break;
  }
#endif

  LOG << "f = " << CS.force.transpose() << std::endl;


  for(bi=0; bi<CS.contactConstraints.size(); ++bi) {
    unsigned int body_id =
      CS.contactConstraints[bi]->getBodyIds()[0];
    unsigned int movable_body_id = body_id;

    if (model.IsFixedBodyId(body_id)) {
      unsigned int fbody_id = body_id - model.fixed_body_discriminator;
      movable_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    }
    ci = CS.contactConstraints[bi]->getConstraintIndex();

    for(unsigned int k=0;
        k<CS.contactConstraints[bi]->getConstraintSize(); ++k) {
      CS.f_ext_constraints[movable_body_id] -= CS.f_t[ci+k] * CS.force[ci+k];
      LOG << "f_ext[" << movable_body_id << "] = "
          << CS.f_ext_constraints[movable_body_id].transpose() << std::endl;
    }

  }



  {
    SUPPRESS_LOGGING;
    ForwardDynamicsApplyConstraintForces (model, Tau, CS, QDDot);
  }

  LOG << "QDDot after applying f_ext: " << QDDot.transpose() << std::endl;
}


//==============================================================================
#ifndef RBDL_USE_CASADI_MATH
RBDL_DLLAPI
bool isConstrainedSystemFullyActuated(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;


  assert (CS.S.cols()    == QDot.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;


  CalcConstrainedSystemVariables(model,Q,QDot,VectorNd::Zero(QDot.rows()),CS,
                                 f_ext);

  CS.GPT = CS.G*CS.P.transpose();

  CS.GPT_full_qr.compute(CS.GPT);
  unsigned int r = unsigned(CS.GPT_full_qr.rank());

  bool isCompatible = false;
  if(r == (n-na)) {
    isCompatible = true;
  } else {
    isCompatible = false;
  }

  return isCompatible;

}
#endif

RBDL_DLLAPI
void InverseDynamicsConstraints(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotDesired,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (QDot.size()         == QDDotDesired.size());
  assert (QDDotDesired.size() == QDot.size());
  assert (QDDotOutput.size()  == QDot.size());
  assert (TauOutput.size()    == CS.H.rows());

  assert (CS.S.cols()     == QDDotDesired.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,f_ext);

  // This implementation follows the projected KKT system described in
  // Eqn. 5.20 of Henning Koch's thesis work. Note that this will fail
  // for under actuated systems
  //  [ SMS'      SMP'    SJ'    I][      u]   [ -SC    ]
  //  [ PMS'      PMP'    PJ'     ][      v] = [ -PC    ]
  //  [ JS'        JP'     0      ][-lambda]   [ -gamma ]
  //  [ I                         ][   -tau]   [  v*     ]
  //double alpha = 0.1;

  CS.Ful = CS.S*CS.H*CS.S.transpose();
  CS.Fur = CS.S*CS.H*CS.P.transpose();
  CS.Fll = CS.P*CS.H*CS.S.transpose();
  CS.Flr = CS.P*CS.H*CS.P.transpose();

  CS.GTu = CS.S*(CS.G.transpose());
  CS.GTl = CS.P*(CS.G.transpose());

  //Exploiting the block triangular structure
  //u:
  //I u = S*qdd*
  CS.u = CS.S*QDDotDesired;
  // v
  //(JP')v = -gamma - (JS')u
  //Using GT

  //This fails using SimpleMath and I'm not sure how to fix it
  SolveLinearSystem( CS.GTl.transpose(),
                     CS.gamma - CS.GTu.transpose()*CS.u,
                     CS.v, CS.linear_solver);

  // lambda
  SolveLinearSystem(CS.GTl,
                    -CS.P*CS.C
                    - CS.Fll*CS.u
                    - CS.Flr*CS.v,
                    CS.force,
                    CS.linear_solver);

  for(unsigned int i=0; i<CS.force.rows(); ++i) {
    CS.force[i] *= -1.0;
  }

  //Evaluating qdd
  QDDotOutput = CS.S.transpose()*CS.u + CS.P.transpose()*CS.v;

  //Evaluating tau
  TauOutput = -CS.S.transpose()*( -CS.S*CS.C
                                  -( CS.Ful*CS.u
                                     +CS.Fur*CS.v
                                     -CS.GTu*CS.force));




}

#ifndef RBDL_USE_CASADI_MATH
RBDL_DLLAPI
void InverseDynamicsConstraintsRelaxed(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotControls,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  std::vector<Math::SpatialVector> *f_ext)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  //Check that the input vectors and matricies are sized appropriately
  assert(Q.size()               == model.q_size);
  assert(QDot.size()            == model.qdot_size);
  assert(QDDotControls.size()    == model.dof_count);
  assert(CS.S.cols()            == model.dof_count);
  assert(CS.W.rows()            == CS.W.cols());
  assert(CS.W.rows()            == CS.S.rows());
  assert(QDDotOutput.size()     == model.dof_count);

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,f_ext);

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  //MM 2020/5/29:
  //  The updates I made to Henning's original formulation have
  //  almost certainly made the sensitivity of the resulting qdd
  //  w.r.t. the controls poorly scaled. At least this is a suspicion
  //  of mine looking at how an OCP is behaving when using this operator.
  //  Reverting to the original formulation.
  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    more closely satisfy QDDotControls if it is possible.
  //double diag = 0.;//100.*CS.H.maxCoeff();
  //double diagInv = 0.;
  //for(unsigned int i=0; i<CS.H.rows(); ++i) {
  //  for(unsigned int j=0; j<CS.H.cols(); ++j) {
  //    if(fabs(CS.H(i,j)) > diag) {
  //      diag = fabs(CS.H(i,j));
  //    }
  //  }
  //}
  //diag = diag*100.;
  //diagInv = 1.0/diag;
  //for(unsigned int i=0; i<CS.W.rows(); ++i) {
  //  CS.W(i,i)    = diag;
  //  CS.Winv(i,i) = diagInv;
  //}

  CS.W = 100.0*CS.S*CS.H*CS.S.transpose();
  CS.Winv = CS.W.inverse();
  CS.WinvSC = CS.Winv * CS.S * CS.C;

  //CS.W = CS.S*CS.H*CS.S.transpose();

  CS.F.block(  0,  0, na, na) = CS.S*CS.H*CS.S.transpose() + CS.W;
  CS.F.block(  0, na, na, nu) = CS.S*CS.H*CS.P.transpose();
  CS.F.block( na,  0, nu, na) = CS.P*CS.H*CS.S.transpose();
  CS.F.block( na, na, nu, nu) = CS.P*CS.H*CS.P.transpose();

  CS.GT.block(  0, 0,na, nc) = CS.S*(CS.G.transpose());
  CS.GT.block( na, 0,nu, nc) = CS.P*(CS.G.transpose());

  CS.GT_qr.compute (CS.GT);
  CS.GT_qr.householderQ().evalTo (CS.GT_qr_Q);

  //GT = [Y  Z] * [ R ]
  //              [ 0 ]

  CS.R  = CS.GT_qr_Q.transpose()*CS.GT;
  CS.Ru = CS.R.block(0,0,nc,nc);

  CS.Y = CS.GT_qr_Q.block( 0, 0,  n, nc    );
  CS.Z = CS.GT_qr_Q.block( 0, nc, n, (n-nc));

  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    exactly satisfy QDDotControls if it is possible.
  //
  //Modify QDDotControls so that SN is cancelled.
  //
  //    +SC - WS(qdd*)
  //
  // Add a term to cancel off SN
  //
  //    +SC - WS( qdd* + (S' W^-1 S)N )
  //

  CS.u = CS.S*CS.C - CS.W*(CS.S*(QDDotControls
                                 +(CS.S.transpose()*CS.WinvSC)));
  //CS.u =  CS.S*CS.C - CS.W*(CS.S*QDDotControls);
  CS.v =  CS.P*CS.C;

  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.g[i] = CS.u[i];
  }
  unsigned int j=CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.g[j] = CS.v[i];
    ++j;
  }

  //nc x nc system
  SolveLinearSystem(CS.Ru.transpose(), CS.gamma, CS.py, CS.linear_solver);

  //(n-nc) x (n-nc) system
  SolveLinearSystem(CS.Z.transpose()*CS.F*CS.Z,
                    CS.Z.transpose()*(-CS.F*CS.Y*CS.py-CS.g),
                    CS.pz,
                    CS.linear_solver);

  //nc x nc system
  SolveLinearSystem(CS.Ru,
                    CS.Y.transpose()*(CS.g + CS.F*CS.Y*CS.py + CS.F*CS.Z*CS.pz),
                    CS.force, CS.linear_solver);

  //Eqn. 32d, the equation for qdd, is in error. Instead
  // p = Ypy + Zpz = [v,w]
  // qdd = S'v + P'w
  QDDotOutput = CS.Y*CS.py + CS.Z*CS.pz;
  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.u[i] = QDDotOutput[i];
  }
  j = CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.v[i] = QDDotOutput[j];
    ++j;
  }

  QDDotOutput = CS.S.transpose()*CS.u
                +CS.P.transpose()*CS.v;

  TauOutput = (CS.S.transpose()*CS.W*CS.S)*(
                QDDotControls+(CS.S.transpose()*CS.WinvSC)
                -QDDotOutput);
  //TauOutput =  CS.S.transpose()*CS.W*CS.S*(QDDotControls - QDDotOutput);


}
#endif

void SolveLinearSystem (
  const MatrixNd& A,
  const VectorNd& b,
  VectorNd& x,
  LinearSolver ls
)
{
  if(A.rows() != b.size() || A.cols() != x.size()) {
    throw Errors::RBDLSizeMismatchError("Mismatching sizes.\n");
  }

#ifdef RBDL_USE_CASADI_MATH
  auto linsol = casadi::Linsol("linear_solver", "symbolicqr", A.sparsity());
  x = linsol.solve(A, b);
#else
  // Solve the system A*x = b.
  switch (ls) {
  case (LinearSolverPartialPivLU) :
    x = A.partialPivLu().solve(b);
    break;
  case (LinearSolverColPivHouseholderQR) :
    x = A.colPivHouseholderQr().solve(b);
    break;
  case (LinearSolverHouseholderQR) :
    x = A.householderQr().solve(b);
    break;
  default:
    std::ostringstream errormsg;
    errormsg << "Error: Invalid linear solver: " << ls << std::endl;
    throw Errors::RBDLError(errormsg.str());
    break;
  }
#endif
}

//==============================================================================
unsigned int GetMovableBodyId (Model& model, unsigned int id)
{
  if(model.IsFixedBodyId(id)) {
    unsigned int fbody_id = id - model.fixed_body_discriminator;
    return model.mFixedBodies[fbody_id].mMovableParent;
  } else {
    return id;
  }
}

//==============================================================================

void ConstraintSet::calcForces(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  std::vector< unsigned int > &constraintBodyIdsUpd,
  std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
  std::vector< Math::SpatialVector > &constraintForcesUpd,
  bool resolveAllInRootFrame,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  constraints[groupIndex]->calcConstraintForces(model,0.,Q,QDot,G,force,
      constraintBodyIdsUpd,
      constraintBodyFramesUpd,
      constraintForcesUpd,
      cache,
      resolveAllInRootFrame,
      updKin);
}

//==============================================================================

void ConstraintSet::calcImpulses(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  std::vector< unsigned int > &constraintBodyIdsUpd,
  std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
  std::vector< Math::SpatialVector > &constraintImpulsesUpd,
  bool resolveAllInRootFrame,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  //The transformation is identical to resolve the impulses
  //to the desired frame
  constraints[groupIndex]->calcConstraintForces(model,0.,Q,QDot,G,impulse,
      constraintBodyIdsUpd,
      constraintBodyFramesUpd,
      constraintImpulsesUpd,
      cache,
      resolveAllInRootFrame,
      updKin);

  //But due to Martin's choice of signs on the Lagrange multipliers vs
  //impulses the signs are opposite
  for(unsigned int i=0; i<constraintImpulsesUpd.size(); ++i) {
    constraintImpulsesUpd[i] *= -1.0;
  }
}

//==============================================================================

void ConstraintSet::calcPositionError(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  Math::VectorNd &posErrUpd,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  //Update the position errors for this constraint in the system level
  //error vector
  constraints[groupIndex]->calcPositionError(model,0.,Q,err,cache,updKin);

  //Pick out the position errors for this constraint from the system level
  //error vector.
  constraints[groupIndex]->getPositionError(err,posErrUpd);

}
//==============================================================================

void ConstraintSet::calcVelocityError(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  Math::VectorNd &velErrUpd,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  //Update the constraint Jacobian of this constraint
  constraints[groupIndex]->calcConstraintJacobian(model,0.,Q,QDot,G,cache,
      updKin);

  //Update the velocity-level errors of this constraint
  constraints[groupIndex]->calcVelocityError(model,0.,Q,QDot,G,errd,cache,
      updKin);

  //Pick out the sub vector of velocity errors for this constraint from
  //the system error vector.
  constraints[groupIndex]->getVelocityError(errd,velErrUpd);

}
//==============================================================================

void ConstraintSet::calcBaumgarteStabilizationForces(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &positionError,
  const Math::VectorNd &velocityError,
  Math::VectorNd &baumgarteForces)
{
  assert(groupIndex <= unsigned(constraints.size()-1));
  assert(positionError.rows() == constraints[groupIndex]->getConstraintSize());
  assert(velocityError.rows() == constraints[groupIndex]->getConstraintSize());

  constraints[groupIndex]->getBaumgarteStabilizationForces(positionError,
      velocityError,
      baumgarteForces);

}

}